

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_NOURISH(effect_handler_context_t_conflict *context)

{
  byte local_75;
  wchar_t local_74;
  byte local_5d;
  wchar_t local_5c;
  byte local_45;
  wchar_t local_44;
  byte local_2d;
  wchar_t local_2c;
  _Bool message;
  wchar_t amount;
  effect_handler_context_t_conflict *context_local;
  
  local_5c = effect_calculate_value(context,false);
  local_5c = (uint)z_info->food_value * local_5c;
  if (context->subtype == 0) {
    local_2c = local_5c;
    if (local_5c < L'\0') {
      local_2c = L'\0';
    }
    local_2d = 1;
    if ((context->origin).what == SRC_PLAYER) {
      local_2d = context->aware ^ 0xff;
    }
    player_inc_timed(player,L'\n',local_2c,false,(_Bool)(local_2d & 1),false);
  }
  else if (context->subtype == 1) {
    local_44 = local_5c;
    if (local_5c < L'\0') {
      local_44 = L'\0';
    }
    local_45 = 1;
    if ((context->origin).what == SRC_PLAYER) {
      local_45 = context->aware ^ 0xff;
    }
    player_dec_timed(player,L'\n',local_44,false,(_Bool)(local_45 & 1));
  }
  else if (context->subtype == 2) {
    if (local_5c < player->timed[10]) {
      msg("You vomit!");
    }
    if (local_5c < L'\0') {
      local_5c = L'\0';
    }
    local_5d = 1;
    if ((context->origin).what == SRC_PLAYER) {
      local_5d = context->aware ^ 0xff;
    }
    player_set_timed(player,L'\n',local_5c,false,(_Bool)(local_5d & 1));
  }
  else {
    if (context->subtype != 3) {
      return false;
    }
    if (player->timed[10] < local_5c) {
      if (local_5c + L'\x01' < 0) {
        local_74 = L'\0';
      }
      else {
        local_74 = local_5c + L'\x01';
      }
      local_75 = 1;
      if ((context->origin).what == SRC_PLAYER) {
        local_75 = context->aware ^ 0xff;
      }
      player_set_timed(player,L'\n',local_74,false,(_Bool)(local_75 & 1));
    }
  }
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_NOURISH(effect_handler_context_t *context)
{
	int amount = effect_calculate_value(context, false);
	amount *= z_info->food_value;
	if (context->subtype == 0) {
		/* Increase food level by amount */
		player_inc_timed(player, TMD_FOOD, MAX(amount, 0), false,
			context->origin.what != SRC_PLAYER || !context->aware,
			false);
	} else if (context->subtype == 1) {
		/* Decrease food level by amount */
		player_dec_timed(player, TMD_FOOD, MAX(amount, 0), false,
			context->origin.what != SRC_PLAYER || !context->aware);
	} else if (context->subtype == 2) {
		/* Set food level to amount, vomiting if necessary */
		bool message = player->timed[TMD_FOOD] > amount;
		if (message) {
			msg("You vomit!");
		}
		player_set_timed(player, TMD_FOOD, MAX(amount, 0), false,
			context->origin.what != SRC_PLAYER || !context->aware);
	} else if (context->subtype == 3) {
		/* Increase food level to amount if needed */
		if (player->timed[TMD_FOOD] < amount) {
			player_set_timed(player, TMD_FOOD, MAX(amount + 1, 0),
				false, context->origin.what != SRC_PLAYER
				|| !context->aware);
		}
	} else {
		return false;
	}
	context->ident = true;
	return true;
}